

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O0

bool __thiscall OpenMD::ifstrstream::is_open(ifstrstream *this)

{
  byte bVar1;
  
  bVar1 = std::filebuf::is_open();
  return (bool)(bVar1 & 1);
}

Assistant:

bool ifstrstream::is_open() {
#ifdef IS_MPI
    return isRead;
#else
    // single version fall back to ifstream
    return internalFileBuf_.is_open();
#endif
  }